

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

uint32_t __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::FindIndex
          (NodeSet *this,int32_t v)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  int in_EDX;
  ulong uVar5;
  int iVar6;
  ulong uVar4;
  
  uVar2 = in_EDX * 0x29 & v - 1U;
  uVar4 = (ulong)uVar2;
  iVar6 = (this->table_).space_[uVar4 - 2];
  if (iVar6 != in_EDX) {
    bVar1 = false;
    uVar5 = 0;
    do {
      uVar3 = (uint32_t)uVar4;
      if (iVar6 == -2) {
        if (!bVar1) {
          bVar1 = true;
          uVar5 = uVar4;
        }
      }
      else if (iVar6 == -1) {
        if (bVar1) {
          uVar3 = (uint32_t)uVar5;
        }
        return uVar3;
      }
      uVar2 = uVar3 + 1 & v - 1U;
      uVar4 = (ulong)uVar2;
      iVar6 = (this->table_).space_[uVar4 - 2];
    } while (iVar6 != in_EDX);
  }
  return uVar2;
}

Assistant:

uint32_t FindIndex(int32_t v) const {
    // Search starting at hash index.
    const uint32_t mask = table_.size() - 1;
    uint32_t i = Hash(v) & mask;
    uint32_t deleted_index = 0;  // index of first deleted element we see
    bool seen_deleted_element = false;
    while (true) {
      int32_t e = table_[i];
      if (v == e) {
        return i;
      } else if (e == kEmpty) {
        // Return any previously encountered deleted slot.
        return seen_deleted_element ? deleted_index : i;
      } else if (e == kDel && !seen_deleted_element) {
        // Keep searching since v might be present later.
        deleted_index = i;
        seen_deleted_element = true;
      }
      i = (i + 1) & mask;  // Linear probing; quadratic is slightly slower.
    }
  }